

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# localize.h
# Opt level: O3

void __thiscall
wasm::ChildLocalizer::ChildLocalizer
          (ChildLocalizer *this,Expression *input,Function *func,Module *wasm,PassOptions *options)

{
  Expression **ppEVar1;
  Type TVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  Index index;
  pointer pppEVar5;
  undefined1 *puVar6;
  Expression ***pppEVar7;
  Expression *pEVar8;
  pointer pppEVar9;
  pointer pppEVar10;
  Type type;
  int iVar11;
  uint uVar12;
  EffectAnalyzer *this_00;
  undefined1 local_c0 [8];
  ChildIterator iterator;
  undefined1 auStack_68 [8];
  vector<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_> effects;
  Builder local_48;
  Builder builder;
  LocalSet *local_38;
  Expression *child;
  
  (this->sets).super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sets).super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sets).super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  type.id = (uintptr_t)options;
  local_48.wasm = wasm;
  builder.wasm = (Module *)this;
  AbstractChildIterator<wasm::ChildIterator>::AbstractChildIterator
            ((AbstractChildIterator<wasm::ChildIterator> *)local_c0,input);
  auStack_68 = (undefined1  [8])0x0;
  effects.super__Vector_base<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  effects.super__Vector_base<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pppEVar10 = (pointer)(((long)iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.
                               flexible.
                               super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                               ._M_impl.super__Vector_impl_data._M_start -
                         (long)iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.
                               fixed._M_elems[3] >> 3) + (long)local_c0);
  if (pppEVar10 != (pointer)0x0) {
    pppEVar5 = (pointer)0x0;
    pppEVar9 = (pointer)&DAT_00000001;
    do {
      puVar6 = (undefined1 *)(~(ulong)pppEVar5 + (long)pppEVar10);
      pppEVar7 = (Expression ***)
                 (iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed._M_elems
                  [3] + (long)(puVar6 + -4));
      if (puVar6 < (undefined1 *)0x4) {
        pppEVar7 = iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed._M_elems
                   + (long)(puVar6 + -1);
      }
      local_38 = (LocalSet *)**pppEVar7;
      std::vector<wasm::EffectAnalyzer,std::allocator<wasm::EffectAnalyzer>>::
      emplace_back<wasm::PassOptions_const&,wasm::Module&,wasm::Expression*&>
                ((vector<wasm::EffectAnalyzer,std::allocator<wasm::EffectAnalyzer>> *)auStack_68,
                 options,wasm,(Expression **)&local_38);
      bVar4 = pppEVar9 < pppEVar10;
      pppEVar5 = pppEVar9;
      pppEVar9 = (pointer)(ulong)((int)pppEVar9 + 1);
    } while (bVar4);
    iVar11 = 0;
    pppEVar5 = (pointer)0x0;
    do {
      puVar6 = (undefined1 *)(~(ulong)pppEVar5 + (long)pppEVar10);
      pppEVar7 = (Expression ***)
                 (iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed._M_elems
                  [3] + (long)(puVar6 + -4));
      if (puVar6 < (undefined1 *)0x4) {
        pppEVar7 = iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed._M_elems
                   + (long)(puVar6 + -1);
      }
      ppEVar1 = *pppEVar7;
      pEVar8 = *ppEVar1;
      if ((pEVar8->type).id == 1) break;
      this_00 = (EffectAnalyzer *)((long)auStack_68 + pppEVar5 * 0x170);
      iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.flexible.
      super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = pppEVar5;
      bVar4 = EffectAnalyzer::hasNonTrapSideEffects(this_00);
      if ((bVar4) || ((this_00->trap != false && (this_00->trapsNeverHappen == false)))) {
LAB_00715b84:
        auVar3._8_8_ = 0;
        auVar3._0_8_ = (pEVar8->type).id;
        index = Builder::addVar((Builder *)func,(Function *)0x0,(Name)(auVar3 << 0x40),type);
        local_38 = Builder::makeLocalSet(&local_48,index,pEVar8);
        std::vector<wasm::LocalSet*,std::allocator<wasm::LocalSet*>>::emplace_back<wasm::LocalSet*>
                  ((vector<wasm::LocalSet*,std::allocator<wasm::LocalSet*>> *)builder.wasm,&local_38
                  );
        TVar2.id = (pEVar8->type).id;
        pEVar8 = (Expression *)MixedArena::allocSpace(&(local_48.wasm)->allocator,0x18,8);
        pEVar8->_id = 8;
        pEVar8[1]._id = index;
        (pEVar8->type).id = TVar2.id;
        *ppEVar1 = pEVar8;
      }
      else {
        uVar12 = 1;
        pppEVar9 = (pointer)0x0;
        do {
          if (iVar11 + uVar12 != 1) {
            bVar4 = EffectAnalyzer::invalidates
                              ((EffectAnalyzer *)((long)auStack_68 + pppEVar5 * 0x170),
                               (EffectAnalyzer *)((long)auStack_68 + pppEVar9 * 0x170));
            if (bVar4) goto LAB_00715b84;
          }
          pppEVar9 = (pointer)(ulong)uVar12;
          uVar12 = uVar12 + 1;
        } while (pppEVar9 < pppEVar10);
      }
      pppEVar5 = (pointer)(ulong)((int)iterator.super_AbstractChildIterator<wasm::ChildIterator>.
                                       children.flexible.
                                       super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
      iVar11 = iVar11 + -1;
    } while (pppEVar5 < pppEVar10);
  }
  std::vector<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_>::~vector
            ((vector<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_> *)auStack_68);
  if (iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed._M_elems[3] !=
      (Expression **)0x0) {
    operator_delete(iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed.
                    _M_elems[3],
                    (long)iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.
                          flexible.
                          super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed.
                          _M_elems[3]);
  }
  return;
}

Assistant:

ChildLocalizer(Expression* input,
                 Function* func,
                 Module* wasm,
                 const PassOptions& options) {
    Builder builder(*wasm);
    ChildIterator iterator(input);
    auto& children = iterator.children;
    auto num = children.size();

    // Compute the effects of all children.
    std::vector<EffectAnalyzer> effects;
    for (Index i = 0; i < num; i++) {
      // The children are in reverse order in ChildIterator, but we want to
      // process them in the normal order.
      auto* child = *children[num - 1 - i];
      effects.emplace_back(options, *wasm, child);
    }

    // Go through the children and move to locals those that we need to.
    for (Index i = 0; i < num; i++) {
      auto** childp = children[num - 1 - i];
      auto* child = *childp;
      if (child->type == Type::unreachable) {
        break;
      }

      // Use a local if we need to. That is the case either if this has side
      // effects we can't remove, or if it interacts with other children.
      bool needLocal = effects[i].hasUnremovableSideEffects();
      if (!needLocal) {
        for (Index j = 0; j < num; j++) {
          if (j != i && effects[i].invalidates(effects[j])) {
            needLocal = true;
            break;
          }
        }
      }
      if (needLocal) {
        auto local = builder.addVar(func, child->type);
        sets.push_back(builder.makeLocalSet(local, child));
        *childp = builder.makeLocalGet(local, child->type);
      }
    }
  }